

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O3

void __thiscall
TEST_WiningStateTest_DoubleReady_TestShell::~TEST_WiningStateTest_DoubleReady_TestShell
          (TEST_WiningStateTest_DoubleReady_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(WiningStateTest, DoubleReady)
{
	addNoWiningHand();

	h.doubleReady();
	winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleReady));
	CHECK_EQUAL(2, r.doubling_factor);
}